

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O2

void UnitTest::
     ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper>
               (DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper
                *testObject,TestDetails *details)

{
  TestDetails *details_00;
  TestResults *results;
  int iVar1;
  TestDetails **ppTVar2;
  DeferredTestResultList *this;
  reference pvVar3;
  const_reference pvVar4;
  TestResults **ppTVar5;
  undefined8 *puVar6;
  char *goodStr;
  TestDetails local_538;
  char failureMessage [128];
  SignalTranslator sig;
  
  ppTVar2 = CurrentTest::Details();
  *ppTVar2 = details;
  SignalTranslator::SignalTranslator(&sig);
  iVar1 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar1 == 0) {
    details_00 = &(testObject->super_DeferredTestReporterFixture).details;
    DeferredTestReporter::ReportTestStart((DeferredTestReporter *)testObject,details_00);
    goodStr = "Real failure message";
    builtin_strncpy(failureMessage,"Real failure message",0x15);
    DeferredTestReporter::ReportFailure
              ((DeferredTestReporter *)testObject,details_00,failureMessage);
    builtin_strncpy(failureMessage,"Bogus failure message",0x16);
    this = DeferredTestReporter::GetResults((DeferredTestReporter *)testObject);
    pvVar3 = std::
             vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::at
                       (this,0);
    pvVar4 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&pvVar3->failures,0);
    ppTVar5 = CurrentTest::Results();
    results = *ppTVar5;
    ppTVar2 = CurrentTest::Details();
    TestDetails::TestDetails(&local_538,*ppTVar2,0x72);
    CheckEqual<char_const*,std::__cxx11::string>(results,&goodStr,&pvVar4->second,&local_538);
    SignalTranslator::~SignalTranslator(&sig);
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Unhandled system exception";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}